

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

string * __thiscall
(anonymous_namespace)::Helper::GetCxxModulesBmiDestination_abi_cxx11_
          (string *__return_storage_ptr__,void *this,cmInstallCommandArguments *args)

{
  pointer pcVar1;
  string *psVar2;
  
  if (this == (void *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_((cmInstallCommandArguments *)this)
    ;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Helper::GetCxxModulesBmiDestination(
  const cmInstallCommandArguments* args) const
{
  if (args) {
    return args->GetDestination();
  }
  return {};
}